

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O3

void __thiscall sjtu::invalid_command::~invalid_command(invalid_command *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_exception)._vptr_exception = (_func_int **)&PTR_what_abi_cxx11__00123888;
  pcVar1 = (this->wro)._M_dataplus._M_p;
  paVar2 = &(this->wro).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  (this->super_exception)._vptr_exception = (_func_int **)&PTR_what_abi_cxx11__001238a0;
  pcVar1 = (this->super_exception).detail._M_dataplus._M_p;
  paVar2 = &(this->super_exception).detail.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_exception).variant._M_dataplus._M_p;
  paVar2 = &(this->super_exception).variant.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

invalid_command() {
	    wro = "invalid_command";
	}